

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFForceManager::~SPFForceManager(SPFForceManager *this)

{
  Snapshot *pSVar1;
  
  (this->super_ForceManager)._vptr_ForceManager = (_func_int **)&PTR__SPFForceManager_002c3a08;
  pSVar1 = this->temporarySourceSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  pSVar1 = this->temporarySinkSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->sinkSavedPositions_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sinkPoint_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sinkNeighborList_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->sourceSavedPositions_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sourcePoint_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sourceNeighborList_).super__Vector_base<int,_std::allocator<int>_>);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::~unique_ptr(&this->thermo_)
  ;
  ForceManager::~ForceManager(&this->super_ForceManager);
  return;
}

Assistant:

SPFForceManager::~SPFForceManager() {
    delete temporarySourceSnapshot_;
    delete temporarySinkSnapshot_;
  }